

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O0

size_t arangodb::velocypack::anon_unknown_0::JSONSkipWhiteSpaceSSE42(uint8_t *ptr,size_t limit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  __m128i s;
  __m128i s_1;
  int x;
  size_t count;
  __m128i w;
  size_t limit_local;
  uint8_t *ptr_local;
  size_t local_20;
  
  count = 0;
  limit_local = limit;
  ptr_local = ptr;
  while( true ) {
    if (limit_local < 0x10) {
      if (limit_local == 0) {
        local_20 = count;
      }
      else {
        auVar2[8] = ' ';
        auVar2[9] = ' ';
        auVar2[10] = ' ';
        auVar2[0xb] = ' ';
        auVar2[0xc] = ' ';
        auVar2[0xd] = ' ';
        auVar2[0xe] = ' ';
        auVar2[0xf] = ' ';
        auVar2[0] = ' ';
        auVar2[1] = '\t';
        auVar2[2] = '\n';
        auVar2[3] = '\r';
        auVar2[4] = ' ';
        auVar2[5] = ' ';
        auVar2[6] = ' ';
        auVar2[7] = ' ';
        x = pcmpistri(auVar2,*(undefined1 (*) [16])ptr_local,0x10);
        if (limit_local < (ulong)(long)x) {
          x = (int)limit_local;
        }
        local_20 = (long)x + count;
      }
      return local_20;
    }
    auVar1[8] = ' ';
    auVar1[9] = ' ';
    auVar1[10] = ' ';
    auVar1[0xb] = ' ';
    auVar1[0xc] = ' ';
    auVar1[0xd] = ' ';
    auVar1[0xe] = ' ';
    auVar1[0xf] = ' ';
    auVar1[0] = ' ';
    auVar1[1] = '\t';
    auVar1[2] = '\n';
    auVar1[3] = '\r';
    auVar1[4] = ' ';
    auVar1[5] = ' ';
    auVar1[6] = ' ';
    auVar1[7] = ' ';
    iVar3 = pcmpistri(auVar1,*(undefined1 (*) [16])ptr_local,0x10);
    if (iVar3 < 0x10) break;
    ptr_local = ptr_local + 0x10;
    limit_local = limit_local - 0x10;
    count = count + 0x10;
  }
  return (long)iVar3 + count;
}

Assistant:

std::size_t JSONSkipWhiteSpaceSSE42(uint8_t const* ptr, std::size_t limit) {
  alignas(16) static char const white[17] = " \t\n\r            ";
  __m128i const w = _mm_load_si128(reinterpret_cast<__m128i const*>(white));
  std::size_t count = 0;
  int x = 0;
  while (limit >= 16) {
    __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(ptr));
    x = _mm_cmpistri(w, /* 4, */ s, /*  16, */
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY |
                         _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
    if (x < 16) {
      count += x;
      return count;
    }
    ptr += 16;
    limit -= 16;
    count += 16;
  }
  if (limit == 0) {
    return count;
  }
  __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(ptr));
  x = _mm_cmpistri(w, /* 4, */ s, /* limit, */
                   _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY |
                       _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
  if (static_cast<std::size_t>(x) > limit) {
    x = static_cast<int>(limit);
  }
  count += x;
  return count;
}